

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  sign_t sVar1;
  float_specs fVar2;
  byte bVar3;
  int iVar4;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  appender aVar7;
  undefined8 uVar8;
  sign_t *psVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  size_t sVar16;
  bool bVar17;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ad0ecca5 write;
  int num_zeros;
  undefined1 local_d7 [19];
  int local_c4;
  float_specs local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  float_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c0.precision = f->significand;
  uVar13 = 0x1f;
  if ((local_c0.precision | 1U) != 0) {
    for (; (local_c0.precision | 1U) >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  uVar11 = (ulong)(uint)local_c0.precision +
           *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar13 * 8);
  local_c4 = (int)(uVar11 >> 0x20);
  local_d7[2] = '0';
  local_d7._11_4_ = fspecs._4_4_;
  local_d7[1] = fspecs._5_1_;
  fVar2 = fspecs;
  if ((long)uVar11 < 0) goto LAB_00112012;
  bVar17 = local_d7[1] != none;
  local_d7[0] = '.';
  uVar13 = (uint)local_d7._11_4_ >> 0x11;
  local_d7._7_8_ = fspecs;
  if ((uVar13 & 1) != 0) {
    local_d7[0] = decimal_point_impl<char>(loc);
  }
  uVar8 = local_a8._M_allocated_capacity;
  lVar15 = (ulong)bVar17 + (uVar11 >> 0x20);
  uVar13 = f->exponent;
  local_c0._4_4_ = local_c4 + uVar13;
  iVar14 = (int)local_d7._7_8_;
  if (SUB81(local_d7._7_8_,4) == '\x01') {
LAB_00111c77:
    iVar10 = uVar13 + local_c4 + -1;
    if (((uint)local_d7._11_4_ >> 0x13 & 1) == 0) {
      uVar11 = 0;
      if (local_c4 == 1) {
        local_d7[0] = '\0';
      }
    }
    else {
      uVar11 = 0;
      if (0 < iVar14 - local_c4) {
        uVar11 = (ulong)(uint)(iVar14 - local_c4);
      }
      lVar15 = lVar15 + uVar11;
    }
    local_b8[0] = local_d7[1];
    local_b8._4_4_ = local_c0.precision;
    local_b8[0xc] = local_d7[0];
    local_b8._8_4_ = local_c4;
    local_a8._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar11);
    local_a8._M_allocated_capacity._6_2_ = SUB82(uVar8,6);
    local_a8._M_allocated_capacity =
         CONCAT26(local_a8._M_allocated_capacity._6_2_,
                  CONCAT15((((uint)local_d7._11_4_ >> 0x10 & 1) == 0) << 5,
                           local_a8._M_allocated_capacity._0_5_)) | 0x450000000000;
    local_a8._8_4_ = iVar10;
    if (specs->width < 1) {
      bVar5.container =
           (buffer<char> *)
           do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
           ::anon_class_28_8_ad0ecca5::operator()
                     ((anon_class_28_8_ad0ecca5 *)local_b8,
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    else {
      if ((int)local_c0._4_4_ < 1) {
        iVar10 = 1 - local_c0._4_4_;
      }
      lVar12 = 2;
      if (99 < iVar10) {
        lVar12 = (ulong)(999 < iVar10) + 3;
      }
      sVar16 = lVar15 + lVar12 + (3 - (ulong)(local_d7[0] == '\0'));
      bVar5.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                     (out,specs,sVar16,sVar16,(anon_class_28_8_ad0ecca5 *)local_b8);
    }
  }
  else {
    if ((local_d7._7_8_ & 0xff00000000) == 0) {
      iVar10 = 0x10;
      if (0 < iVar14) {
        iVar10 = iVar14;
      }
      if (((int)local_c0._4_4_ < -3) || (iVar10 < (int)local_c0._4_4_)) goto LAB_00111c77;
    }
    if ((int)uVar13 < 0) {
      if ((int)local_c0._4_4_ < 1) {
        iVar4 = -local_c0._4_4_;
        iVar10 = iVar4;
        if (SBORROW4(iVar14,iVar4) != iVar14 + local_c0._4_4_ < 0) {
          iVar10 = iVar14;
        }
        if (iVar14 < 0) {
          iVar10 = iVar4;
        }
        if (local_c4 != 0) {
          iVar10 = iVar4;
        }
        local_70._M_allocated_capacity._0_4_ = iVar10;
        bVar3 = 1;
        if (local_c4 == 0 && iVar10 == 0) {
          bVar3 = (local_d7[0xd] & 8) >> 3;
        }
        local_d7[3] = bVar3;
        fVar2 = (float_specs)local_d7._7_8_;
        if (-1 < iVar10) {
          sVar16 = lVar15 + (ulong)((uint)bVar3 + iVar10 + 1);
          local_b8._0_8_ = local_d7 + 1;
          local_b8._8_8_ = local_d7 + 2;
          local_a8._M_allocated_capacity = (size_type)(local_d7 + 3);
          local_a8._8_8_ = local_d7;
          local_98._M_p = (pointer)&local_70;
          local_90 = &local_c0;
          local_88._M_allocated_capacity = (size_type)&local_c4;
          aVar7 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                            (out,specs,sVar16,sVar16,(anon_class_56_7_162c6e41 *)local_b8);
          return (appender)
                 aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.
                 container;
        }
LAB_00112012:
        local_d7._7_8_ = fVar2;
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/core.h"
                    ,0x178,"negative value");
      }
      uVar13 = iVar14 - local_c4 & (int)(local_d7._11_4_ << 0xc) >> 0x1f;
      local_d7._3_4_ = uVar13;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_b8,loc,
                 (bool)((byte)((uint)local_d7._11_4_ >> 0x11) & 1));
      iVar14 = 0;
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      sVar16 = (ulong)uVar13 + (uVar11 >> 0x20) + (ulong)bVar17;
      psVar9 = (sign_t *)local_b8._0_8_;
      do {
        iVar10 = 0x7fffffff;
        if (local_90 != (float_specs *)0x0) {
          if (psVar9 == (sign_t *)(local_b8._0_8_ + (long)(int *)local_b8._8_8_)) {
            uVar13 = (uint)(char)((sign_t *)(local_b8._0_8_ + (long)(int *)local_b8._8_8_))[-1];
          }
          else {
            sVar1 = *psVar9;
            if ((byte)(sVar1 + 0x81) < 0x82) goto LAB_00111edb;
            psVar9 = psVar9 + 1;
            uVar13 = (uint)sVar1;
          }
          iVar14 = iVar14 + uVar13;
          iVar10 = iVar14;
        }
LAB_00111edb:
        sVar16 = sVar16 + 1;
      } while (iVar10 < (int)local_c0._4_4_);
      local_70._M_allocated_capacity = (size_type)(local_d7 + 1);
      local_70._8_8_ = &local_c0;
      local_60._M_allocated_capacity = (size_type)&local_c4;
      local_60._8_8_ = &local_c0.field_0x4;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d7;
      local_40._M_allocated_capacity = (size_type)(local_d7 + 3);
      local_40._8_8_ = local_d7 + 2;
      local_48 = (digit_grouping<char> *)local_b8;
      bVar5.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     (out,specs,sVar16,sVar16,(anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p);
      }
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_b8 + 0x10);
    }
    else {
      lVar15 = lVar15 + (ulong)uVar13;
      local_d7._3_4_ = iVar14 - local_c0._4_4_;
      if (((uint)local_d7._11_4_ >> 0x13 & 1) != 0) {
        if (SUB81(local_d7._7_8_,4) != '\x02' && (int)local_d7._3_4_ < 1) {
          local_d7._3_4_ = 0;
        }
        lVar15 = lVar15 + 1;
        if (0 < (long)(int)local_d7._3_4_) {
          lVar15 = lVar15 + (int)local_d7._3_4_;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,
                 (bool)((byte)((uint)local_d7._11_4_ >> 0x11) & 1));
      sVar16 = lVar15 - 1;
      iVar14 = 0;
      uVar8 = local_70._0_8_;
      do {
        iVar10 = 0x7fffffff;
        if (local_48 != (digit_grouping<char> *)0x0) {
          if ((byte *)uVar8 == (byte *)(local_70._M_allocated_capacity + local_70._8_8_)) {
            uVar13 = (uint)(char)((byte *)(local_70._M_allocated_capacity + local_70._8_8_))[-1];
          }
          else {
            bVar3 = *(byte *)uVar8;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_00111daf;
            uVar8 = uVar8 + 1;
            uVar13 = (uint)bVar3;
          }
          iVar14 = iVar14 + uVar13;
          iVar10 = iVar14;
        }
LAB_00111daf:
        sVar16 = sVar16 + 1;
      } while (iVar10 < (int)local_c0._4_4_);
      local_b8._0_8_ = local_d7 + 1;
      local_b8._8_8_ = &local_c0;
      local_a8._M_allocated_capacity = (size_type)&local_c4;
      local_90 = (float_specs *)(local_d7 + 7);
      local_88._M_allocated_capacity = (size_type)local_d7;
      local_88._8_8_ = local_d7 + 3;
      local_78 = local_d7 + 2;
      local_a8._8_8_ = f;
      local_98._M_p = (pointer)&local_70;
      bVar5.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (out,specs,sVar16,sVar16,(anon_class_72_9_0c6a3a8a *)local_b8);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      paVar6 = &local_60;
    }
    if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)(paVar6->_M_local_buf + -0x10) != paVar6) {
      operator_delete(*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)(paVar6->_M_local_buf + -0x10));
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}